

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O2

void gen_hermite_dr_compute(int order,double alpha,double *x,double *w)

{
  int order_00;
  double *weight;
  double *xtab;
  int iVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  double *pdVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  
  if (order == 1) {
    *x = 0.0;
    dVar9 = tgamma((alpha + 1.0) * 0.5);
    *w = dVar9;
    return;
  }
  iVar1 = order % 2;
  dVar9 = alpha + 1.0;
  if (iVar1 == 0) {
    dVar9 = alpha + -1.0;
  }
  iVar5 = order - (uint)(iVar1 != 0);
  uVar8 = (long)iVar5 / 2;
  order_00 = (int)uVar8;
  lVar2 = (long)order_00;
  uVar3 = 0xffffffffffffffff;
  if (-2 < iVar5) {
    uVar3 = lVar2 * 8;
  }
  weight = (double *)operator_new__(uVar3);
  xtab = (double *)operator_new__(uVar3);
  gen_laguerre_ss_compute(order_00,dVar9 * 0.5,xtab,weight);
  if (iVar1 == 0) {
    uVar3 = 0;
    uVar7 = 0;
    if (0 < order_00) {
      uVar7 = uVar8 & 0xffffffff;
    }
    pdVar6 = xtab + lVar2;
    for (; pdVar6 = pdVar6 + -1, uVar7 != uVar3; uVar3 = uVar3 + 1) {
      dVar9 = *pdVar6;
      if (dVar9 < 0.0) {
        dVar9 = sqrt(dVar9);
      }
      else {
        dVar9 = SQRT(dVar9);
      }
      x[uVar3] = -dVar9;
    }
    for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      dVar9 = xtab[uVar8];
      if (dVar9 < 0.0) {
        dVar9 = sqrt(dVar9);
      }
      else {
        dVar9 = SQRT(dVar9);
      }
      x[lVar2 + uVar8] = dVar9;
    }
    pdVar6 = weight + lVar2;
    for (uVar8 = 0; pdVar6 = pdVar6 + -1, uVar7 != uVar8; uVar8 = uVar8 + 1) {
      w[uVar8] = *pdVar6 * 0.5;
    }
    for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      w[lVar2 + uVar8] = weight[uVar8] * 0.5;
    }
  }
  else if (iVar1 == 1) {
    uVar3 = 0;
    uVar7 = 0;
    if (0 < order_00) {
      uVar7 = uVar8 & 0xffffffff;
    }
    pdVar6 = xtab + lVar2;
    for (; pdVar6 = pdVar6 + -1, uVar7 != uVar3; uVar3 = uVar3 + 1) {
      dVar9 = *pdVar6;
      if (dVar9 < 0.0) {
        dVar9 = sqrt(dVar9);
      }
      else {
        dVar9 = SQRT(dVar9);
      }
      x[uVar3] = -dVar9;
    }
    x[lVar2] = 0.0;
    for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      dVar9 = xtab[uVar8];
      if (dVar9 < 0.0) {
        dVar9 = sqrt(dVar9);
      }
      else {
        dVar9 = SQRT(dVar9);
      }
      x[lVar2 + uVar8 + 1] = dVar9;
    }
    pdVar6 = w;
    for (lVar4 = 0; -lVar4 != uVar7; lVar4 = lVar4 + -1) {
      *pdVar6 = (weight[lVar2 + lVar4 + -1] * 0.5) / xtab[lVar2 + lVar4 + -1];
      pdVar6 = pdVar6 + 1;
    }
    dVar9 = tgamma((alpha + 1.0) * 0.5);
    w[lVar2] = dVar9;
    for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      dVar9 = dVar9 - weight[uVar8] / xtab[uVar8];
      w[lVar2] = dVar9;
    }
    for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      w[lVar2 + 1 + uVar8] = (weight[uVar8] * 0.5) / xtab[uVar8];
    }
  }
  operator_delete__(weight);
  operator_delete__(xtab);
  return;
}

Assistant:

void gen_hermite_dr_compute ( int order, double alpha, double x[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    GEN_HERMITE_DR_COMPUTE computes a generalized Gauss-Hermite rule.
//
//  Discussion:
//
//    The integral:
//
//      Integral ( -oo < x < +oo ) |x|^ALPHA exp(-x^2) f(x) dx
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    02 March 2008
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Philip Davis, Philip Rabinowitz,
//    Methods of Numerical Integration,
//    Second Edition,
//    Dover, 2007,
//    ISBN: 0486453391,
//    LC: QA299.3.D28.
//
//  Parameters:
//
//    Input, int ORDER, the order.
//
//    Input, double ALPHA, the parameter.
//    -1.0 < ALPHA.
//
//    Output, double X[ORDER], the abscissas.
//
//    Output, double W[ORDER], the weights.
//
{
  double alpha_laguerre;
  double arg;
  int i;
  int order_laguerre;
  double *w_laguerre;
  double *x_laguerre;

  if ( order == 1 )
  {
    arg = ( alpha + 1.0 ) / 2.0;
    x[0] = 0.0;
    w[0] = tgamma ( arg );
    return;
  }

  if ( ( order % 2 ) == 0 ) 
  {
    order_laguerre = order / 2;
    alpha_laguerre = ( alpha - 1.0 ) / 2.0;
  }
  else
  {
    order_laguerre = ( order - 1 ) / 2;
    alpha_laguerre = ( alpha + 1.0 ) / 2.0;
  }
  
  w_laguerre = new double[order_laguerre];
  x_laguerre = new double[order_laguerre];

  gen_laguerre_ss_compute ( order_laguerre, alpha_laguerre, 
    x_laguerre, w_laguerre );

  if ( ( order % 2 ) == 0 )
  {
    for ( i = 0; i < order_laguerre; i++ )
    {
      x[i] = - sqrt ( x_laguerre[order_laguerre-1-i] );
    }
    for ( i = 0; i < order_laguerre; i++ )
    {
      x[order_laguerre+i] = sqrt ( x_laguerre[i] );
	}
    for ( i = 0; i < order_laguerre; i++ )
    {
      w[i] = 0.5 * w_laguerre[order_laguerre-1-i];
    }
    for ( i = 0; i < order_laguerre; i++ )
    {
      w[order_laguerre+i] = 0.5 * w_laguerre[i];
    }
  }
  else if ( ( order % 2 ) == 1 )
  {
    for ( i = 0; i < order_laguerre; i++ )
    {
      x[i] = - sqrt ( x_laguerre[order_laguerre-1-i] );
    }
    x[order_laguerre] = 0.0;
    for ( i = 0; i < order_laguerre; i++ )
    {
      x[order_laguerre+1+i] = sqrt ( x_laguerre[i] );
	}
    for ( i = 0; i < order_laguerre; i++ )
    {
      w[i] = 0.5 * w_laguerre[order_laguerre-1-i] / x_laguerre[order_laguerre-1-i];
    }

    arg = ( alpha + 1.0 ) / 2.0;
    w[order_laguerre] = tgamma ( arg );
    for ( i = 0; i < order_laguerre; i++ )
    {
      w[order_laguerre] = w[order_laguerre] - w_laguerre[i] / x_laguerre[i];
    }

    for ( i = 0; i < order_laguerre; i++ )
    {
      w[order_laguerre+1+i] = 0.5 * w_laguerre[i] / x_laguerre[i];
    }
  }
  delete [] w_laguerre;
  delete [] x_laguerre;

  return;
}